

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

MsgType * FIX::identifyType(MsgType *__return_storage_ptr__,string *message)

{
  MessageParseError *pMVar1;
  undefined1 local_b0 [8];
  string value;
  string local_88;
  long local_68;
  size_type soh;
  size_type startValue;
  allocator<char> local_41;
  string local_40;
  long local_20;
  size_type pos;
  string *message_local;
  
  pos = (size_type)message;
  message_local = (string *)__return_storage_ptr__;
  local_20 = std::__cxx11::string::find((char *)message,0x2c3aa6);
  if (local_20 == -1) {
    startValue._3_1_ = 1;
    pMVar1 = (MessageParseError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    MessageParseError::MessageParseError(pMVar1,&local_40);
    startValue._3_1_ = 0;
    __cxa_throw(pMVar1,&MessageParseError::typeinfo,MessageParseError::~MessageParseError);
  }
  soh = local_20 + 4;
  local_68 = std::__cxx11::string::find_first_of((char)pos,1);
  if (local_68 == -1) {
    value.field_2._M_local_buf[0xe] = '\x01';
    pMVar1 = (MessageParseError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"",(allocator<char> *)(value.field_2._M_local_buf + 0xf));
    MessageParseError::MessageParseError(pMVar1,&local_88);
    value.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pMVar1,&MessageParseError::typeinfo,MessageParseError::~MessageParseError);
  }
  std::__cxx11::string::substr((ulong)local_b0,pos);
  MsgType::MsgType(__return_storage_ptr__,(STRING *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

inline MsgType identifyType( const std::string& message )
EXCEPT ( MessageParseError )
{
  std::string::size_type pos = message.find( "\001" "35=" );
  if ( pos == std::string::npos ) throw MessageParseError();

  std::string::size_type startValue = pos + 4;
  std::string::size_type soh = message.find_first_of( '\001', startValue );
  if ( soh == std::string::npos ) throw MessageParseError();

  std::string value = message.substr( startValue, soh - startValue );
  return MsgType( value );
}